

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

bool __thiscall Potassco::AspifTextInput::match(AspifTextInput *this,char *term,bool req)

{
  bool bVar1;
  byte bVar2;
  StringBuilder *this_00;
  char *pcVar3;
  byte in_DL;
  undefined8 in_RSI;
  char *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  StringBuilder local_60;
  byte local_19;
  undefined8 local_18;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  bVar1 = ProgramReader::match
                    ((ProgramReader *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68,false);
  if (bVar1) {
    skipws((AspifTextInput *)0x10e3db);
  }
  else {
    bVar2 = local_19 ^ 1;
    StringBuilder::StringBuilder((StringBuilder *)0x10e401);
    this_00 = StringBuilder::appendFormat(&local_60,"\'%s\' expected",local_18);
    pcVar3 = StringBuilder::c_str(this_00);
    ProgramReader::require
              ((ProgramReader *)CONCAT17(bVar2,in_stack_ffffffffffffff70),
               SUB81((ulong)pcVar3 >> 0x38,0),(char *)0x10e44b);
    StringBuilder::~StringBuilder(this_00);
  }
  return bVar1;
}

Assistant:

bool AspifTextInput::match(const char* term, bool req) {
	if (ProgramReader::match(term, false)) { skipws(); return true; }
	require(!req, POTASSCO_FORMAT("'%s' expected", term));
	return false;
}